

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

void CopyTempOutputBuffersToHostOutputBuffers(PaUtilBufferProcessor *bp)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  unsigned_long *puVar7;
  void *pvVar8;
  PaUtilChannelDescriptor *pPVar9;
  ulong uVar10;
  uint local_4c;
  
  uVar4 = bp->framesInTempOutputBuffer;
  if (uVar4 != 0) {
    puVar7 = bp->hostOutputFrameCount;
    puVar1 = bp->hostOutputFrameCount + 1;
    do {
      uVar2 = *puVar7;
      if (uVar2 + *puVar1 == 0) {
        return;
      }
      uVar10 = *puVar1;
      if (uVar2 != 0) {
        uVar10 = uVar2;
      }
      if (uVar4 <= uVar10) {
        uVar10 = uVar4;
      }
      if (bp->userOutputIsInterleaved == 0) {
        pvVar8 = (void *)((bp->framesPerUserBuffer - uVar4) * (ulong)bp->bytesPerUserOutputSample +
                         (long)bp->tempOutputBuffer);
        uVar6 = (int)bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
        local_4c = 1;
      }
      else {
        uVar6 = bp->bytesPerUserOutputSample;
        local_4c = bp->outputChannelCount;
        pvVar8 = (void *)((bp->framesPerUserBuffer - uVar4) * (ulong)(local_4c * uVar6) +
                         (long)bp->tempOutputBuffer);
      }
      if (bp->outputChannelCount != 0) {
        pPVar9 = bp->hostOutputChannels[uVar2 == 0];
        uVar5 = 0;
        do {
          if (pPVar9->data == (void *)0x0) {
            __assert_fail("hostOutputChannels[i].data != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                          ,0x4e9,
                          "void CopyTempOutputBuffersToHostOutputBuffers(PaUtilBufferProcessor *)");
          }
          (*bp->outputConverter)
                    (pPVar9->data,pPVar9->stride,pvVar8,local_4c,(uint)uVar10,&bp->ditherGenerator);
          pvVar8 = (void *)((long)pvVar8 + (ulong)uVar6);
          pPVar9->data = (void *)((long)pPVar9->data +
                                 (ulong)(pPVar9->stride * (uint)uVar10 *
                                        bp->bytesPerHostOutputSample));
          uVar5 = uVar5 + 1;
          pPVar9 = pPVar9 + 1;
        } while (uVar5 < bp->outputChannelCount);
      }
      uVar2 = *puVar7;
      puVar3 = puVar7;
      if (uVar2 == 0) {
        uVar2 = *puVar1;
        puVar3 = puVar1;
      }
      *puVar3 = uVar2 - (uVar10 & 0xffffffff);
      uVar4 = bp->framesInTempOutputBuffer - (uVar10 & 0xffffffff);
      bp->framesInTempOutputBuffer = uVar4;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

static void CopyTempOutputBuffersToHostOutputBuffers( PaUtilBufferProcessor *bp)
{
    unsigned long maxFramesToCopy;
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int frameCount;
    unsigned char *srcBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

     /* copy frames from user to host output buffers */
     while( bp->framesInTempOutputBuffer > 0 &&
             ((bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]) > 0) )
     {
         maxFramesToCopy = bp->framesInTempOutputBuffer;

         /* select the output buffer set (1st or 2nd) */
         if( bp->hostOutputFrameCount[0] > 0 )
         {
             hostOutputChannels = bp->hostOutputChannels[0];
             frameCount = PA_MIN_( bp->hostOutputFrameCount[0], maxFramesToCopy );
         }
         else
         {
             hostOutputChannels = bp->hostOutputChannels[1];
             frameCount = PA_MIN_( bp->hostOutputFrameCount[1], maxFramesToCopy );
         }

         if( bp->userOutputIsInterleaved )
         {
             srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                     bp->bytesPerUserOutputSample * bp->outputChannelCount *
                     (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);
                         
             srcSampleStrideSamples = bp->outputChannelCount;
             srcChannelStrideBytes = bp->bytesPerUserOutputSample;
         }
         else /* user output is not interleaved */
         {
             srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                     bp->bytesPerUserOutputSample *
                     (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

             srcSampleStrideSamples = 1;
             srcChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
         }

         for( i=0; i<bp->outputChannelCount; ++i )
         {
             assert( hostOutputChannels[i].data != NULL );
             bp->outputConverter(    hostOutputChannels[i].data,
                                     hostOutputChannels[i].stride,
                                     srcBytePtr, srcSampleStrideSamples,
                                     frameCount, &bp->ditherGenerator );

             srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

             /* advance dest ptr for next iteration */
             hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                     frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
         }

         if( bp->hostOutputFrameCount[0] > 0 )
             bp->hostOutputFrameCount[0] -= frameCount;
         else
             bp->hostOutputFrameCount[1] -= frameCount;

         bp->framesInTempOutputBuffer -= frameCount;
     }
}